

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  char *__last;
  long lVar1;
  ulong uVar2;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  int iVar8;
  char_type buffer [26];
  undefined8 uStack_50;
  char acStack_48 [40];
  
  bVar3 = (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)it->container;
  uVar6 = *(ulong *)this;
  lVar1 = (long)*(int *)(this + 8);
  __last = acStack_48 + lVar1;
  pcVar7 = __last;
  if (uVar6 < 100) {
    if (uVar6 < 10) goto LAB_001d7741;
    uVar6 = (ulong)(uint)((int)uVar6 * 2);
    pcVar7 = acStack_48 + lVar1 + -1;
    acStack_48[lVar1 + -1] = internal::basic_data<void>::DIGITS[uVar6 + 1];
  }
  else {
    iVar8 = 0;
    do {
      uVar5 = uVar6;
      uVar6 = uVar5 / 100;
      uVar2 = (ulong)(uint)(((int)uVar5 + (int)uVar6 * -100) * 2);
      pcVar7[-1] = internal::basic_data<void>::DIGITS[uVar2 + 1];
      if (iVar8 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        *(num_writer *)(pcVar7 + -2) = this[0xc];
        pcVar7[-3] = internal::basic_data<void>::DIGITS[uVar2];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar1 = -4;
          goto LAB_001d76f4;
        }
        pcVar7 = pcVar7 + -3;
      }
      else {
        pcVar7[-2] = internal::basic_data<void>::DIGITS[uVar2];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar1 = -3;
LAB_001d76f4:
          *(num_writer *)(pcVar7 + lVar1) = this[0xc];
          pcVar7 = pcVar7 + lVar1;
        }
        else {
          pcVar7 = pcVar7 + -2;
        }
      }
      iVar8 = iVar8 + 2;
    } while (9999 < uVar5);
    if (uVar5 < 1000) {
LAB_001d7741:
      bVar4 = (byte)uVar6 | 0x30;
      goto LAB_001d7773;
    }
    uVar6 = (ulong)(uint)((int)uVar6 * 2);
    pcVar7[-1] = internal::basic_data<void>::DIGITS[uVar6 + 1];
    if (iVar8 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
      *(num_writer *)(pcVar7 + -2) = this[0xc];
      pcVar7 = pcVar7 + -2;
    }
    else {
      pcVar7 = pcVar7 + -1;
    }
  }
  bVar4 = internal::basic_data<void>::DIGITS[uVar6];
LAB_001d7773:
  pcVar7[-1] = bVar4;
  uStack_50 = 0x1d7782;
  bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    (acStack_48,__last,bVar3);
  it->container = (list<char,_std::allocator<char>_> *)bVar3;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }